

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

BOOL __thiscall
Js::TypedArrayBase::SetAttributes
          (TypedArrayBase *this,PropertyId propertyId,PropertyAttributes attributes)

{
  BOOL BVar1;
  uint32 local_2c;
  ScriptContext *pSStack_28;
  uint32 index;
  ScriptContext *scriptContext;
  PropertyAttributes attributes_local;
  TypedArrayBase *pTStack_18;
  PropertyId propertyId_local;
  TypedArrayBase *this_local;
  
  scriptContext._3_1_ = attributes;
  scriptContext._4_4_ = propertyId;
  pTStack_18 = this;
  pSStack_28 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  BVar1 = ScriptContext::IsNumericPropertyId(pSStack_28,scriptContext._4_4_,&local_2c);
  if (BVar1 == 0) {
    this_local._4_4_ =
         DynamicObject::SetAttributes((DynamicObject *)this,scriptContext._4_4_,scriptContext._3_1_)
    ;
  }
  else {
    ArrayObject::VerifySetItemAttributes
              ((ArrayObject *)this,scriptContext._4_4_,scriptContext._3_1_);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL TypedArrayBase::SetAttributes(PropertyId propertyId, PropertyAttributes attributes)
    {
        ScriptContext* scriptContext = this->GetScriptContext();
        uint32 index;

        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            VerifySetItemAttributes(propertyId, attributes);
            return true;
        }

        return __super::SetAttributes(propertyId, attributes);
    }